

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

istream * Json::operator>>(istream *sin,Value *root)

{
  undefined8 uVar1;
  istream *in_RDI;
  bool ok;
  string errs;
  CharReaderBuilder b;
  string *in_stack_00000128;
  Value *in_stack_00000130;
  istream *in_stack_00000138;
  Factory *in_stack_00000140;
  FILE *in_stack_ffffffffffffff40;
  CharReaderBuilder *this;
  allocator local_99;
  string local_98 [55];
  undefined1 local_61;
  string local_60 [32];
  CharReaderBuilder local_40;
  istream *local_8;
  
  this = &local_40;
  local_8 = in_RDI;
  CharReaderBuilder::CharReaderBuilder(this);
  std::__cxx11::string::string(local_60);
  local_61 = parseFromStream(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128
                            );
  if (!(bool)local_61) {
    in_stack_ffffffffffffff40 = _stderr;
    uVar1 = std::__cxx11::string::c_str();
    fprintf(in_stack_ffffffffffffff40,"Error from reader: %s",uVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"reader error",&local_99);
    throwRuntimeError((string *)this);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  std::__cxx11::string::~string(local_60);
  CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)in_stack_ffffffffffffff40);
  return local_8;
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  CharReaderBuilder b;
  std::string errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            errs.c_str());

    throwRuntimeError("reader error");
  }
  return sin;
}